

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

void glslang::OutputConstantUnion
               (TInfoSink *out,TIntermTyped *node,TConstUnionArray *constUnion,EExtraOutput extra,
               int depth)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  unsigned_short uVar5;
  int iVar6;
  TBasicType TVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  TConstUnion *pTVar10;
  longlong lVar11;
  unsigned_long_long uVar12;
  TInfoSinkBase *pTVar13;
  TString *this;
  char *s;
  undefined4 extraout_var_00;
  double value;
  char local_9b8 [8];
  char buf_7 [300];
  int maxSize_7;
  char buf_6 [300];
  int maxSize_6;
  char buf_5 [300];
  int maxSize_5;
  char buf_4 [300];
  int maxSize_4;
  char buf_3 [300];
  int maxSize_3;
  char buf_2 [300];
  int maxSize_2;
  char buf_1 [300];
  int maxSize_1;
  char buf [300];
  int local_30;
  int maxSize;
  int i;
  int size;
  int depth_local;
  EExtraOutput extra_local;
  TConstUnionArray *constUnion_local;
  TIntermTyped *node_local;
  TInfoSink *out_local;
  
  iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar6 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar6));
  for (local_30 = 0; local_30 < iVar6; local_30 = local_30 + 1) {
    OutputTreeText(out,&node->super_TIntermNode,depth);
    pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
    TVar7 = TConstUnion::getType(pTVar10);
    switch(TVar7) {
    case EbtFloat:
    case EbtDouble:
    case EbtFloat16:
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      value = TConstUnion::getDConst(pTVar10);
      OutputDouble(out,value,extra);
      TInfoSinkBase::operator<<(&out->debug,"\n");
      break;
    case EbtInt8:
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      cVar2 = TConstUnion::getI8Const(pTVar10);
      snprintf(buf_1 + 0x128,300,"%d (%s)",(ulong)(uint)(int)cVar2,"const int8_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_1 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtUint8:
      buf_1[0x124] = ',';
      buf_1[0x125] = '\x01';
      buf_1[0x126] = '\0';
      buf_1[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      bVar3 = TConstUnion::getU8Const(pTVar10);
      snprintf(buf_2 + 0x128,300,"%u (%s)",(ulong)bVar3,"const uint8_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_2 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtInt16:
      buf_2[0x124] = ',';
      buf_2[0x125] = '\x01';
      buf_2[0x126] = '\0';
      buf_2[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      sVar4 = TConstUnion::getI16Const(pTVar10);
      snprintf(buf_3 + 0x128,300,"%d (%s)",(ulong)(uint)(int)sVar4,"const int16_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_3 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtUint16:
      buf_3[0x124] = ',';
      buf_3[0x125] = '\x01';
      buf_3[0x126] = '\0';
      buf_3[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      uVar5 = TConstUnion::getU16Const(pTVar10);
      snprintf(buf_4 + 0x128,300,"%u (%s)",(ulong)uVar5,"const uint16_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_4 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtInt:
      buf_4[0x124] = ',';
      buf_4[0x125] = '\x01';
      buf_4[0x126] = '\0';
      buf_4[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      uVar8 = TConstUnion::getIConst(pTVar10);
      snprintf(buf_5 + 0x128,300,"%d (%s)",(ulong)uVar8,"const int");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_5 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtUint:
      buf_5[0x124] = ',';
      buf_5[0x125] = '\x01';
      buf_5[0x126] = '\0';
      buf_5[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      uVar8 = TConstUnion::getUConst(pTVar10);
      snprintf(buf_6 + 0x128,300,"%u (%s)",(ulong)uVar8,"const uint");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_6 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtInt64:
      buf_6[0x124] = ',';
      buf_6[0x125] = '\x01';
      buf_6[0x126] = '\0';
      buf_6[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      lVar11 = TConstUnion::getI64Const(pTVar10);
      snprintf(buf_7 + 0x128,300,"%lld (%s)",lVar11,"const int64_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,buf_7 + 0x128);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtUint64:
      buf_7[0x124] = ',';
      buf_7[0x125] = '\x01';
      buf_7[0x126] = '\0';
      buf_7[0x127] = '\0';
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      uVar12 = TConstUnion::getU64Const(pTVar10);
      snprintf(local_9b8,300,"%llu (%s)",uVar12,"const uint64_t");
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,local_9b8);
      TInfoSinkBase::operator<<(pTVar13,"\n");
      break;
    case EbtBool:
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      bVar1 = TConstUnion::getBConst(pTVar10);
      if (bVar1) {
        TInfoSinkBase::operator<<(&out->debug,"true");
      }
      else {
        TInfoSinkBase::operator<<(&out->debug,"false");
      }
      pTVar13 = TInfoSinkBase::operator<<(&out->debug," (");
      pTVar13 = TInfoSinkBase::operator<<(pTVar13,"const bool");
      TInfoSinkBase::operator<<(pTVar13,")");
      TInfoSinkBase::operator<<(&out->debug,"\n");
      break;
    default:
      iVar9 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
      TInfoSinkBase::message
                (&out->info,EPrefixInternalError,"Unknown constant",
                 (TSourceLoc *)CONCAT44(extraout_var_00,iVar9),false,false);
      break;
    case EbtString:
      pTVar13 = TInfoSinkBase::operator<<(&out->debug,"\"");
      pTVar10 = TConstUnionArray::operator[](constUnion,(long)local_30);
      this = TConstUnion::getSConst_abi_cxx11_(pTVar10);
      s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          c_str(this);
      pTVar13 = TInfoSinkBase::operator<<(pTVar13,s);
      TInfoSinkBase::operator<<(pTVar13,"\"\n");
    }
  }
  return;
}

Assistant:

static void OutputConstantUnion(TInfoSink& out, const TIntermTyped* node, const TConstUnionArray& constUnion,
    TOutputTraverser::EExtraOutput extra, int depth)
{
    int size = node->getType().computeNumComponents();

    for (int i = 0; i < size; i++) {
        OutputTreeText(out, node, depth);
        switch (constUnion[i].getType()) {
        case EbtBool:
            if (constUnion[i].getBConst())
                out.debug << "true";
            else
                out.debug << "false";

            out.debug << " (" << "const bool" << ")";

            out.debug << "\n";
            break;
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            OutputDouble(out, constUnion[i].getDConst(), extra);
            out.debug << "\n";
            break;
        case EbtInt8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI8Const(), "const int8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU8Const(), "const uint8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI16Const(), "const int16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU16Const(), "const uint16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getIConst(), "const int");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getUConst(), "const uint");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%lld (%s)", constUnion[i].getI64Const(), "const int64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%llu (%s)", constUnion[i].getU64Const(), "const uint64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtString:
            out.debug << "\"" << constUnion[i].getSConst()->c_str() << "\"\n";
            break;
        default:
            out.info.message(EPrefixInternalError, "Unknown constant", node->getLoc());
            break;
        }
    }
}